

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

bool duckdb::CanScaleDownDecimal<int>(int input,DecimalScaleInput<int,_int> *data)

{
  long lVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  lVar1 = *(long *)(NumericHelper::POWERS_OF_TEN + (ulong)data->source_scale * 8);
  lVar3 = -((long)input % lVar1);
  if (-1 < input) {
    lVar3 = (long)input % lVar1;
  }
  iVar4 = -input;
  if (0 < input) {
    iVar4 = input;
  }
  iVar2 = (int)lVar1;
  if (lVar3 < lVar1 / 2) {
    iVar2 = 0;
  }
  iVar2 = iVar2 + iVar4;
  iVar4 = data->limit;
  return (iVar2 != -iVar4 && SBORROW4(iVar2,-iVar4) == iVar2 + iVar4 < 0) && iVar2 < iVar4;
}

Assistant:

bool CanScaleDownDecimal(INPUT_TYPE input, DecimalScaleInput<INPUT_TYPE> &data) {
	int64_t divisor = UnsafeNumericCast<int64_t>(NumericHelper::POWERS_OF_TEN[data.source_scale]);
	auto value = input % divisor;
	auto rounded_input = input;
	if (rounded_input < 0) {
		rounded_input *= -1;
		value *= -1;
	}
	if (value >= divisor / 2) {
		rounded_input += divisor;
	}
	return rounded_input < data.limit && rounded_input > -data.limit;
}